

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deMemPool.c
# Opt level: O0

int deMemPool_getCapacity(deMemPool *pool,deBool recurse)

{
  int iVar1;
  deMemPool *local_28;
  deMemPool *child;
  MemPage *memPage;
  int numCapacityBytes;
  deBool recurse_local;
  deMemPool *pool_local;
  
  memPage._0_4_ = 0;
  for (child = (deMemPool *)pool->currentPage; child != (deMemPool *)0x0; child = child->parent) {
    memPage._0_4_ = child->flags + (int)memPage;
  }
  if (recurse != 0) {
    for (local_28 = pool->firstChild; local_28 != (deMemPool *)0x0; local_28 = local_28->nextPool) {
      iVar1 = deMemPool_getCapacity(local_28,1);
      memPage._0_4_ = iVar1 + (int)memPage;
    }
  }
  return (int)memPage;
}

Assistant:

int deMemPool_getCapacity (const deMemPool* pool, deBool recurse)
{
	int			numCapacityBytes = 0;
	MemPage*	memPage;

	for (memPage = pool->currentPage; memPage; memPage = memPage->nextPage)
		numCapacityBytes += memPage->capacity;

	if (recurse)
	{
		deMemPool* child;
		for (child = pool->firstChild; child; child = child->nextPool)
			numCapacityBytes += deMemPool_getCapacity(child, DE_TRUE);
	}

	return numCapacityBytes;
}